

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

void av1_cdef_init_fb_row_mt
               (AV1_COMMON *cm,MACROBLOCKD *xd,CdefBlockInfo *fb_info,uint16_t **linebuf,
               uint16_t *src,AV1CdefSyncData *cdef_sync,int fbr)

{
  int iVar1;
  uint8_t uVar2;
  int iVar3;
  SequenceHeader *pSVar4;
  uint16_t *puVar5;
  AV1CdefRowSync *pAVar6;
  long lVar7;
  uint uVar8;
  int src_voffset;
  int iVar9;
  int iVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  
  pSVar4 = cm->seq_params;
  uVar2 = pSVar4->monochrome;
  iVar10 = (cm->mi_params).mi_rows;
  iVar3 = (cm->mi_params).mi_cols;
  iVar1 = iVar10 + 0xf;
  iVar10 = iVar10 + 0x1e;
  if (-1 < iVar1) {
    iVar10 = iVar1;
  }
  fb_info->frame_boundary[0] = (uint)(fbr == 0);
  iVar1 = (iVar10 >> 4) + -1;
  uVar8 = 1;
  if (iVar1 != fbr) {
    uVar8 = (uint)(fbr * 0x10 + 0x10 == (cm->mi_params).mi_rows);
  }
  fb_info->frame_boundary[2] = uVar8;
  fb_info->src = src;
  fb_info->damping = (cm->cdef_info).cdef_damping;
  fb_info->coeff_shift = pSVar4->bit_depth - AOM_BITS_8;
  memset(fb_info->dir,0,0x800);
  piVar11 = &xd->plane[0].dst.stride;
  uVar12 = 0;
  do {
    iVar9 = (int)(iVar3 * 4 + 0xfU & 0xfffffff0) >> (*(byte *)(piVar11 + -9) & 0x1f);
    iVar13 = iVar9 * (iVar10 >> 4) * 2;
    if (iVar1 != fbr) {
      src_voffset = (fbr + 1) * 0x10 << (2U - (char)piVar11[-8] & 0x1f);
      puVar5 = linebuf[uVar12];
      av1_cdef_copy_sb8_16
                (cm,puVar5 + (fbr * 2 + 2) * iVar9,iVar9,((buf_2d *)(piVar11 + -6))->buf,
                 src_voffset + -2,0,*piVar11,2,iVar9);
      av1_cdef_copy_sb8_16
                (cm,puVar5 + (long)iVar13 + (long)(fbr * 2 * iVar9),iVar9,
                 ((buf_2d *)(piVar11 + -6))->buf,src_voffset,0,*piVar11,2,iVar9);
    }
    iVar9 = iVar9 * fbr * 2;
    fb_info->top_linebuf[uVar12] = linebuf[uVar12] + iVar9;
    fb_info->bot_linebuf[uVar12] = linebuf[uVar12] + (iVar13 + iVar9);
    if (uVar2 != '\0') break;
    piVar11 = piVar11 + 0x28c;
    bVar14 = uVar12 < 2;
    uVar12 = uVar12 + 1;
  } while (bVar14);
  pAVar6 = cdef_sync->cdef_row_mt;
  lVar7 = (long)fbr;
  pthread_mutex_lock((pthread_mutex_t *)pAVar6[lVar7].row_mutex_);
  pthread_cond_signal((pthread_cond_t *)pAVar6[lVar7].row_cond_);
  pAVar6[lVar7].is_row_done = 1;
  pthread_mutex_unlock((pthread_mutex_t *)pAVar6[lVar7].row_mutex_);
  if (fbr != 0) {
    pAVar6 = cdef_sync->cdef_row_mt;
    pthread_mutex_lock((pthread_mutex_t *)pAVar6[lVar7 + -1].row_mutex_);
    while (pAVar6[lVar7 + -1].is_row_done != 1) {
      pthread_cond_wait((pthread_cond_t *)pAVar6[lVar7 + -1].row_cond_,
                        (pthread_mutex_t *)pAVar6[lVar7 + -1].row_mutex_);
    }
    pAVar6[lVar7 + -1].is_row_done = 0;
    pthread_mutex_unlock((pthread_mutex_t *)pAVar6[lVar7 + -1].row_mutex_);
    return;
  }
  return;
}

Assistant:

void av1_cdef_init_fb_row_mt(const AV1_COMMON *const cm,
                             const MACROBLOCKD *const xd,
                             CdefBlockInfo *const fb_info,
                             uint16_t **const linebuf, uint16_t *const src,
                             struct AV1CdefSyncData *const cdef_sync, int fbr) {
  const int num_planes = av1_num_planes(cm);
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int luma_stride =
      ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);

  // for the current filter block, it's top left corner mi structure (mi_tl)
  // is first accessed to check whether the top and left boundaries are
  // frame boundaries. Then bottom-left and top-right mi structures are
  // accessed to check whether the bottom and right boundaries
  // (respectively) are frame boundaries.
  //
  // Note that we can't just check the bottom-right mi structure - eg. if
  // we're at the right-hand edge of the frame but not the bottom, then
  // the bottom-right mi is NULL but the bottom-left is not.
  fb_info->frame_boundary[TOP] = (MI_SIZE_64X64 * fbr == 0) ? 1 : 0;
  if (fbr != nvfb - 1)
    fb_info->frame_boundary[BOTTOM] =
        (MI_SIZE_64X64 * (fbr + 1) == cm->mi_params.mi_rows) ? 1 : 0;
  else
    fb_info->frame_boundary[BOTTOM] = 1;

  fb_info->src = src;
  fb_info->damping = cm->cdef_info.cdef_damping;
  fb_info->coeff_shift = AOMMAX(cm->seq_params->bit_depth - 8, 0);
  av1_zero(fb_info->dir);
  av1_zero(fb_info->var);

  for (int plane = 0; plane < num_planes; plane++) {
    const int stride = luma_stride >> xd->plane[plane].subsampling_x;
    uint16_t *top_linebuf = &linebuf[plane][0];
    uint16_t *bot_linebuf = &linebuf[plane][nvfb * CDEF_VBORDER * stride];
    {
      const int mi_high_l2 = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
      const int top_offset = MI_SIZE_64X64 * (fbr + 1) << mi_high_l2;
      const int bot_offset = MI_SIZE_64X64 * (fbr + 1) << mi_high_l2;

      if (fbr != nvfb - 1)  // if (fbr != 0)  // top line buffer copy
        av1_cdef_copy_sb8_16(
            cm, &top_linebuf[(fbr + 1) * CDEF_VBORDER * stride], stride,
            xd->plane[plane].dst.buf, top_offset - CDEF_VBORDER, 0,
            xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
      if (fbr != nvfb - 1)  // bottom line buffer copy
        av1_cdef_copy_sb8_16(cm, &bot_linebuf[fbr * CDEF_VBORDER * stride],
                             stride, xd->plane[plane].dst.buf, bot_offset, 0,
                             xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
    }

    fb_info->top_linebuf[plane] = &linebuf[plane][fbr * CDEF_VBORDER * stride];
    fb_info->bot_linebuf[plane] =
        &linebuf[plane]
                [nvfb * CDEF_VBORDER * stride + (fbr * CDEF_VBORDER * stride)];
  }

  cdef_row_mt_sync_write(cdef_sync, fbr);
  cdef_row_mt_sync_read(cdef_sync, fbr);
}